

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::ParseURLProtocol(string *URL,string *protocol,string *dataglom,bool decode)

{
  bool bVar1;
  string local_170;
  string local_150;
  string local_130;
  undefined4 local_110;
  undefined1 local_100 [8];
  RegularExpression urlRe;
  bool decode_local;
  string *dataglom_local;
  string *protocol_local;
  string *URL_local;
  
  urlRe._207_1_ = decode;
  RegularExpression::RegularExpression((RegularExpression *)local_100,"([a-zA-Z0-9]*)://(.*)");
  bVar1 = RegularExpression::find((RegularExpression *)local_100,URL);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(&local_130,(RegularExpression *)local_100,1);
    std::__cxx11::string::operator=((string *)protocol,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    RegularExpression::match_abi_cxx11_(&local_150,(RegularExpression *)local_100,2);
    std::__cxx11::string::operator=((string *)dataglom,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    if ((urlRe._207_1_ & 1) != 0) {
      DecodeURL(&local_170,dataglom);
      std::__cxx11::string::operator=((string *)dataglom,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
    URL_local._7_1_ = true;
  }
  else {
    URL_local._7_1_ = false;
  }
  local_110 = 1;
  RegularExpression::~RegularExpression((RegularExpression *)local_100);
  return URL_local._7_1_;
}

Assistant:

bool SystemTools::ParseURLProtocol(const std::string& URL,
                                   std::string& protocol,
                                   std::string& dataglom, bool decode)
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe(VTK_URL_PROTOCOL_REGEX);

  if (!urlRe.find(URL))
    return false;

  protocol = urlRe.match(1);
  dataglom = urlRe.match(2);

  if (decode) {
    dataglom = DecodeURL(dataglom);
  }

  return true;
}